

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O2

PAL_ERROR FileMappingInitializationRoutine
                    (CPalThread *pThread,CObjectType *pObjectType,void *pvImmutableData,
                    void *pvSharedData,void *pvProcessLocalData)

{
  uint uVar1;
  int iVar2;
  PAL_ERROR PVar3;
  
  uVar1 = *(uint *)((long)pvImmutableData + 0x1004);
  iVar2 = 0;
  if ((uVar1 != 2) && (uVar1 != 8)) {
    if (uVar1 == 4) {
      iVar2 = 2;
    }
    else {
      iVar2 = 0;
      fprintf(_stderr,"] %s %s:%d","MAPProtectionToFileOpenFlags",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/map/map.cpp"
              ,0x780);
      fprintf(_stderr,"unexpected flProtect value %#x\n",(ulong)uVar1);
    }
  }
  iVar2 = CorUnix::InternalOpen((char *)pvImmutableData,iVar2);
  *(int *)pvProcessLocalData = iVar2;
  PVar3 = 0x54f;
  if (iVar2 != -1) {
    PVar3 = 0;
  }
  return PVar3;
}

Assistant:

PAL_ERROR
FileMappingInitializationRoutine(
    CPalThread *pThread,
    CObjectType *pObjectType,
    void *pvImmutableData,
    void *pvSharedData,
    void *pvProcessLocalData
    )
{
    PAL_ERROR palError = NO_ERROR;
    
    CFileMappingImmutableData *pImmutableData =
        reinterpret_cast<CFileMappingImmutableData *>(pvImmutableData);
    CFileMappingProcessLocalData *pProcessLocalData =
        reinterpret_cast<CFileMappingProcessLocalData *>(pvProcessLocalData);

    pProcessLocalData->UnixFd = InternalOpen(
        pImmutableData->szFileName,
        MAPProtectionToFileOpenFlags(pImmutableData->flProtect)
        );

    if (-1 == pProcessLocalData->UnixFd)
    {
        palError = ERROR_INTERNAL_ERROR;
        goto ExitFileMappingInitializationRoutine;
    }

#if ONE_SHARED_MAPPING_PER_FILEREGION_PER_PROCESS
    struct stat st;

    if (0 == fstat(pProcessLocalData->UnixFd, &st))
    {
        pProcessLocalData->MappedFileDevNum = st.st_dev;
        pProcessLocalData->MappedFileInodeNum = st.st_ino;
    }
    else
    {
        ERROR("Couldn't get inode info for fd=%d to be stored in mapping object\n", pProcessLocalData->UnixFd);
    }
#endif

ExitFileMappingInitializationRoutine:    

    return palError;
}